

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malicious_aligned_heap_vectorization.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector4d *this;
  Vector4d *this_00;
  double *pdVar4;
  double *pdVar5;
  ostream *poVar6;
  size_t in_RSI;
  Vector4d *v;
  undefined1 auStack_50 [8];
  Vector4d result;
  
  this = (Vector4d *)Vector4d::operator_new((Vector4d *)0x20,in_RSI);
  this->data[0] = 1.0;
  this->data[1] = 1.0;
  this->data[2] = 1.0;
  this->data[3] = 1.0;
  this_00 = (Vector4d *)Vector4d::operator_new((Vector4d *)0x20,in_RSI);
  this_00->data[0] = 1.0;
  this_00->data[1] = 2.0;
  this_00->data[2] = 3.0;
  this_00->data[3] = 4.0;
  pdVar4 = (double *)operator_new(0x20);
  dVar1 = this->data[1];
  dVar2 = this->data[2];
  dVar3 = this->data[3];
  *pdVar4 = this->data[0];
  pdVar4[1] = dVar1;
  pdVar4[2] = dVar2;
  pdVar4[3] = dVar3;
  pdVar5 = (double *)operator_new(0x20);
  dVar1 = this_00->data[1];
  dVar2 = this_00->data[2];
  dVar3 = this_00->data[3];
  *pdVar5 = this_00->data[0];
  pdVar5[1] = dVar1;
  pdVar5[2] = dVar2;
  pdVar5[3] = dVar3;
  poVar6 = std::operator<<((ostream *)&std::cout,"address of point1: ");
  poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"address of point2: ");
  poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  v = (Vector4d *)auStack_50;
  auStack_50 = (undefined1  [8])(*pdVar4 + *pdVar5);
  result.data[0] = pdVar4[1] + pdVar5[1];
  result.data[1] = pdVar4[2] + pdVar5[2];
  result.data[2] = pdVar4[3] + pdVar5[3];
  operator<<((ostream *)&std::cout,v);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Vector4d::operator_delete(this,v);
  Vector4d::operator_delete(this_00,v);
  operator_delete(pdVar4);
  operator_delete(pdVar5);
  return 0;
}

Assistant:

int main() {
  Vector4d* input1 = new Vector4d{1, 1, 1, 1};
  Vector4d* input2 = new Vector4d{1, 2, 3, 4};

  Point* point1 = new Point{*input1};
  Point* point2 = new Point{*input2};

  std::cout << "address of point1: " << point1->position.data << std::endl;
  std::cout << "address of point2: " << point2->position.data << std::endl;

  Vector4d result = point1->position + point2->position;

  std::cout << result << std::endl;

  delete input1;
  delete input2;
  delete point1;
  delete point2;
  return 0;
}